

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

char * __thiscall
spirv_cross::CompilerMSL::descriptor_address_space
          (CompilerMSL *this,uint32_t id,StorageClass storage,char *plain_address_space)

{
  bool bVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  
  if ((this->msl_options).argument_buffers == true) {
    uVar2 = Compiler::get_decoration((Compiler *)this,(ID)id,DecorationDescriptorSet);
    pcVar3 = (char *)CONCAT44(extraout_var,uVar2);
    bVar1 = true;
    if ((((((byte)(0x1005 >> ((byte)storage & 0x1f)) &
           storage < (StorageClassStorageBuffer|StorageClassInput)) == 1) && (uVar2 < 8)) &&
        ((this->msl_options).argument_buffers != false)) &&
       (pcVar3 = (char *)(ulong)this->argument_buffer_discrete_mask,
       (this->argument_buffer_discrete_mask >> (uVar2 & 0x1f) & 1) == 0)) {
      pcVar3 = "const device";
      if ((this->argument_buffer_device_storage_mask >> (uVar2 & 0x1f) & 1) == 0) {
        pcVar3 = "constant";
      }
      bVar1 = false;
    }
    if (!bVar1) {
      return pcVar3;
    }
  }
  return plain_address_space;
}

Assistant:

const char *CompilerMSL::descriptor_address_space(uint32_t id, StorageClass storage, const char *plain_address_space) const
{
	if (msl_options.argument_buffers)
	{
		bool storage_class_is_descriptor = storage == StorageClassUniform ||
		                                   storage == StorageClassStorageBuffer ||
		                                   storage == StorageClassUniformConstant;

		uint32_t desc_set = get_decoration(id, DecorationDescriptorSet);
		if (storage_class_is_descriptor && descriptor_set_is_argument_buffer(desc_set))
		{
			// An awkward case where we need to emit *more* address space declarations (yay!).
			// An example is where we pass down an array of buffer pointers to leaf functions.
			// It's a constant array containing pointers to constants.
			// The pointer array is always constant however. E.g.
			// device SSBO * constant (&array)[N].
			// const device SSBO * constant (&array)[N].
			// constant SSBO * constant (&array)[N].
			// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
			// we emit the buffer array on stack instead, and that seems to work just fine apparently.

			// If the argument was marked as being in device address space, any pointer to member would
			// be const device, not constant.
			if (argument_buffer_device_storage_mask & (1u << desc_set))
				return "const device";
			else
				return "constant";
		}
	}

	return plain_address_space;
}